

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

__pid_t __thiscall acto::core::event::wait(event *this,void *__stat_loc)

{
  bool bVar1;
  undefined1 local_40 [8];
  unique_lock<std::mutex> g;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  event *this_local;
  nanoseconds duration_local;
  
  deadline.__d.__r = (duration)(duration)this;
  this_local = (event *)__stat_loc;
  g._8_8_ = std::chrono::_V2::system_clock::now();
  local_28 = std::chrono::operator+
                       ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&g._M_owns,(duration<long,_std::ratio<1L,_1000000000L>_> *)&this_local);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_40,&this->mutex_);
  bVar1 = std::condition_variable::
          wait_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>,acto::core::event::wait(std::chrono::duration<long,std::ratio<1l,1000000000l>>)::__0>
                    (&this->cond_,(unique_lock<std::mutex> *)local_40,&local_28,
                     (anon_class_8_1_8991fb9c)this);
  if (bVar1) {
    this->triggered_ = (bool)((this->auto_ ^ 0xffU) & 1);
    duration_local.__r._4_4_ = 1;
  }
  else {
    duration_local.__r._4_4_ = 2;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  return duration_local.__r._4_4_;
}

Assistant:

wait_result event::wait(const std::chrono::nanoseconds duration) {
  const auto deadline = std::chrono::high_resolution_clock::now() + duration;
  std::unique_lock g(mutex_);

  if (!cond_.wait_until(g, deadline, [this] { return triggered_; })) {
    return wait_result::timeout;
  }

  triggered_ = !auto_;

  return wait_result::signaled;
}